

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer.cpp
# Opt level: O2

void RegisterSignerRPCCommands(CRPCTable *t)

{
  long lVar1;
  int iVar2;
  CRPCCommand *pcmd;
  long lVar3;
  long in_FS_OFFSET;
  string in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterSignerRPCCommands(CRPCTable&)::commands == '\0') {
    iVar2 = __cxa_guard_acquire(&RegisterSignerRPCCommands(CRPCTable&)::commands);
    if (iVar2 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xffffffffffffffc0,"signer",
                 (allocator<char> *)&stack0xffffffffffffffbf);
      CRPCCommand::CRPCCommand
                (RegisterSignerRPCCommands::commands,in_stack_ffffffffffffffb8,
                 (RpcMethodFnType)&stack0xffffffffffffffc0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterSignerRPCCommands(CRPCTable&)::commands);
    }
  }
  pcmd = RegisterSignerRPCCommands::commands;
  for (lVar3 = 0x80; lVar3 != 0; lVar3 = lVar3 + -0x80) {
    CRPCTable::appendCommand(t,&pcmd->name,pcmd);
    pcmd = pcmd + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterSignerRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"signer", &enumeratesigners},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}